

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void quickSort_recursive<int>(vector<int,_std::allocator<int>_> *vec,int left,int right)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int __tmp;
  long lVar7;
  long lVar8;
  int __tmp_1;
  int iVar9;
  
  if (left < right) {
    do {
      piVar3 = (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      iVar1 = piVar3[left];
      uVar5 = (ulong)(uint)right;
      iVar4 = left;
      do {
        uVar5 = (ulong)(int)uVar5;
        lVar6 = (long)iVar4;
        do {
          iVar9 = piVar3[uVar5];
          if (iVar9 <= iVar1) {
            piVar3[uVar5] = piVar3[lVar6];
            piVar3[lVar6] = iVar9;
            iVar9 = iVar4 + 1;
            break;
          }
          uVar5 = uVar5 - 1;
          iVar9 = iVar4;
        } while (lVar6 < (long)uVar5);
        iVar4 = (int)uVar5;
        if (iVar9 < iVar4) {
          lVar7 = (long)iVar9;
          lVar6 = (long)iVar4;
          lVar8 = 0;
          while (iVar2 = piVar3[lVar7 + lVar8], iVar2 < iVar1) {
            lVar8 = lVar8 + 1;
            if (lVar6 - lVar7 == lVar8) goto LAB_00101450;
          }
          piVar3[lVar7 + lVar8] = piVar3[lVar6];
          piVar3[lVar6] = iVar2;
          uVar5 = (ulong)(iVar4 - 1);
          iVar9 = iVar9 + (int)lVar8;
        }
        iVar4 = iVar9;
      } while (iVar4 < (int)uVar5);
LAB_00101450:
      quickSort_recursive<int>(vec,left,iVar4 + -1);
      left = iVar4 + 1;
    } while (left < right);
  }
  return;
}

Assistant:

void quickSort_recursive(vector<T>& vec, int left, int right)
{
    //若数组为空，算法结束
    if (left >= right)
    {
        return;
    }
    int pivot = vec[left];  //设置基准点为首位的值
    int start = left;   //设置左边的哨兵
    int end = right;    //设置右边的哨兵
    //只要左哨兵小于右哨兵，说明没有遍历完，算法继续
    while (start < end)
    {
        //从右往左寻找小于基准点的值。start < end 是为了避免基准点右边的值全部大于基准点，如3, 7, 6, 5。防止end越界访问
        while (start < end && vec[end] > pivot)
        {
            end--;
        }
        //上述循环退出，说明1、start >= end或则2、vecp[end] < pivot
        //此判断为了防止第一种情况，保证是第二种情况
        if (start < end)
        {
            //交换基准点和符合条件的值
            swap(vec[end], vec[start]);
            //此时start处的值已为小于基准点的值，所以直接从下一位开始遍历
            start++;
        }
        //从左往右寻找大于基准点的值
        while (start < end && vec[start] < pivot)
        {
            start++;
        }
        if (start < end)
        {
            swap(vec[start], vec[end]);
            end--;
        }
    }
    //进入递归,已经就位的基准点将数组分为两部分，分别对其进行快速排序。
    //此时start == end,所以end -1 或者 start - 1都可以。下同理
    quickSort_recursive(vec, left, start - 1);
    quickSort_recursive(vec, start + 1, right);
}